

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

bool __thiscall
QDockAreaLayout::insertGap(QDockAreaLayout *this,QList<int> *path,QLayoutItem *dockWidgetItem)

{
  long lVar1;
  bool bVar2;
  qsizetype in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  int index;
  QLayoutItem *in_stack_00000050;
  QList<int> *in_stack_00000058;
  QDockAreaLayoutInfo *in_stack_00000060;
  QList<int> *in_stack_ffffffffffffffb0;
  QList<int> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<int>::first(in_stack_ffffffffffffffb0);
  QList<int>::mid(in_stack_ffffffffffffffe0,in_RDI,in_RSI);
  bVar2 = QDockAreaLayoutInfo::insertGap(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  QList<int>::~QList((QList<int> *)0x57865a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockAreaLayout::insertGap(const QList<int> &path, QLayoutItem *dockWidgetItem)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    return docks[index].insertGap(path.mid(1), dockWidgetItem);
}